

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall ON_MappingTag::Read(ON_MappingTag *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  TYPE TVar4;
  uint i;
  int mnv;
  int mjv;
  TYPE local_2c;
  int local_28;
  int local_24;
  
  memset(this,0,0x90);
  (this->m_mesh_xform).m_xform[0][0] = 1.0;
  (this->m_mesh_xform).m_xform[1][1] = 1.0;
  (this->m_mesh_xform).m_xform[2][2] = 1.0;
  (this->m_mesh_xform).m_xform[3][3] = 1.0;
  local_24 = 0;
  local_28 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,&local_24,&local_28);
  if (!bVar1) {
    return false;
  }
  if ((local_24 == 1) && (bVar1 = ON_BinaryArchive::ReadUuid(archive,&this->m_mapping_id), bVar1)) {
    iVar3 = ON_UuidCompare(&obsolete_default_srfp_mapping_id,&this->m_mapping_id);
    if (iVar3 == 0) {
      (this->m_mapping_id).Data1 = 0;
      (this->m_mapping_id).Data2 = 0;
      (this->m_mapping_id).Data3 = 0;
      (this->m_mapping_id).Data4[0] = '\0';
      (this->m_mapping_id).Data4[1] = '\0';
      (this->m_mapping_id).Data4[2] = '\0';
      (this->m_mapping_id).Data4[3] = '\0';
      (this->m_mapping_id).Data4[4] = '\0';
      (this->m_mapping_id).Data4[5] = '\0';
      (this->m_mapping_id).Data4[6] = '\0';
      (this->m_mapping_id).Data4[7] = '\0';
    }
    bVar1 = ON_BinaryArchive::ReadInt(archive,&this->m_mapping_crc);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::ReadXform(archive,&this->m_mesh_xform);
      if ((bVar1) && (0 < local_28)) {
        local_2c = this->m_mapping_type;
        bVar1 = ON_BinaryArchive::ReadInt(archive,&local_2c);
        if (bVar1) {
          TVar4 = ON_TextureMapping::TypeFromUnsigned(local_2c);
          this->m_mapping_type = TVar4;
        }
      }
      goto LAB_005152cb;
    }
  }
  bVar1 = false;
LAB_005152cb:
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_MappingTag::Read(ON_BinaryArchive& archive)
{
  Default();
  int mjv = 0, mnv = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&mjv,&mnv);
  if (!rc)
    return false;

  for(;;)
  {
    rc = (1 == mjv);
    if (!rc) break;
    rc = archive.ReadUuid(m_mapping_id);
    if(!rc) break;
    if ( 0 == ON_UuidCompare(&obsolete_default_srfp_mapping_id,&m_mapping_id) )
      m_mapping_id = ON_nil_uuid;
    rc = archive.ReadInt(&m_mapping_crc);
    if(!rc) break;
    rc = archive.ReadXform(m_mesh_xform);
    if(!rc) break;

    if ( mnv >= 1 )
    {
      // 1.1 fields
      unsigned int i = static_cast<unsigned int>(m_mapping_type);
      rc = archive.ReadInt(&i);
      if ( rc )
        m_mapping_type = ON_TextureMapping::TypeFromUnsigned(i);
      if (!rc) break;
    }

    break;
  }

  if ( !archive.EndRead3dmChunk() )
    rc = false;
  
  return rc;
}